

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

void __thiscall duckdb_re2::Compiler::Add_80_10ffff(Compiler *this)

{
  int iVar1;
  int iVar2;
  uint8_t hi;
  uint8_t lo;
  
  if (this->reversed_ == true) {
    iVar1 = UncachedRuneByteSuffix(this,0xc2,0xdf,false,0);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    AddSuffix(this,iVar1);
    iVar1 = UncachedRuneByteSuffix(this,0xe0,0xef,false,0);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    AddSuffix(this,iVar1);
    iVar1 = UncachedRuneByteSuffix(this,0xf0,0xf4,false,0);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    lo = 0x80;
    hi = 0xbf;
  }
  else {
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,0);
    iVar2 = UncachedRuneByteSuffix(this,0xc2,0xdf,false,iVar1);
    AddSuffix(this,iVar2);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    iVar2 = UncachedRuneByteSuffix(this,0xe0,0xef,false,iVar1);
    AddSuffix(this,iVar2);
    iVar1 = UncachedRuneByteSuffix(this,0x80,0xbf,false,iVar1);
    lo = 0xf0;
    hi = 0xf4;
  }
  iVar1 = UncachedRuneByteSuffix(this,lo,hi,false,iVar1);
  AddSuffix(this,iVar1);
  return;
}

Assistant:

void Compiler::Add_80_10ffff() {
  // The 80-10FFFF (Runeself-Runemax) rune range occurs frequently enough
  // (for example, for /./ and /[^a-z]/) that it is worth simplifying: by
  // permitting overlong encodings in E0 and F0 sequences and code points
  // over 10FFFF in F4 sequences, the size of the bytecode and the number
  // of equivalence classes are reduced significantly.
  int id;
  if (reversed_) {
    // Prefix factoring matters, but we don't have to handle it here
    // because the rune range trie logic takes care of that already.
    id = UncachedRuneByteSuffix(0xC2, 0xDF, false, 0);
    id = UncachedRuneByteSuffix(0x80, 0xBF, false, id);
    AddSuffix(id);

    id = UncachedRuneByteSuffix(0xE0, 0xEF, false, 0);
    id = UncachedRuneByteSuffix(0x80, 0xBF, false, id);
    id = UncachedRuneByteSuffix(0x80, 0xBF, false, id);
    AddSuffix(id);

    id = UncachedRuneByteSuffix(0xF0, 0xF4, false, 0);
    id = UncachedRuneByteSuffix(0x80, 0xBF, false, id);
    id = UncachedRuneByteSuffix(0x80, 0xBF, false, id);
    id = UncachedRuneByteSuffix(0x80, 0xBF, false, id);
    AddSuffix(id);
  } else {
    // Suffix factoring matters - and we do have to handle it here.
    int cont1 = UncachedRuneByteSuffix(0x80, 0xBF, false, 0);
    id = UncachedRuneByteSuffix(0xC2, 0xDF, false, cont1);
    AddSuffix(id);

    int cont2 = UncachedRuneByteSuffix(0x80, 0xBF, false, cont1);
    id = UncachedRuneByteSuffix(0xE0, 0xEF, false, cont2);
    AddSuffix(id);

    int cont3 = UncachedRuneByteSuffix(0x80, 0xBF, false, cont2);
    id = UncachedRuneByteSuffix(0xF0, 0xF4, false, cont3);
    AddSuffix(id);
  }
}